

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocketPrivate::_q_disconnectedSlot(QSslSocketPrivate *this)

{
  long lVar1;
  QAbstractSocket *this_00;
  QSslSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  QSslSocket *q;
  undefined6 in_stack_ffffffffffffff78;
  quint16 in_stack_ffffffffffffff7e;
  QSslSocketPrivate *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractSocket *)q_func(in_RDI);
  disconnected(in_stack_ffffffffffffff80);
  QAbstractSocket::disconnected((QAbstractSocket *)0x3a6719);
  QAbstractSocket::setLocalPort
            ((QAbstractSocket *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
  QHostAddress::QHostAddress((QHostAddress *)this_00);
  QAbstractSocket::setLocalAddress
            (this_00,(QHostAddress *)CONCAT26(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78));
  QHostAddress::~QHostAddress((QHostAddress *)0x3a675b);
  QAbstractSocket::setPeerPort(this_00,in_stack_ffffffffffffff7e);
  QHostAddress::QHostAddress((QHostAddress *)this_00);
  QAbstractSocket::setPeerAddress
            (this_00,(QHostAddress *)CONCAT26(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78));
  QHostAddress::~QHostAddress((QHostAddress *)0x3a679b);
  QString::QString((QString *)0x3a67b4);
  QAbstractSocket::setPeerName
            (this_00,(QString *)CONCAT26(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78));
  QString::~QString((QString *)0x3a67cd);
  (in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::_q_disconnectedSlot()
{
    Q_Q(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::_q_disconnectedSlot()";
    qCDebug(lcSsl) << "\tstate =" << q->state();
#endif
    disconnected();
    emit q->disconnected();

    q->setLocalPort(0);
    q->setLocalAddress(QHostAddress());
    q->setPeerPort(0);
    q->setPeerAddress(QHostAddress());
    q->setPeerName(QString());
    cachedSocketDescriptor = -1;
}